

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMCoupe.cpp
# Opt level: O0

bool GetFileTime(MGT_DIR *p,tm *ptm_)

{
  tm *ptVar1;
  time_t tVar2;
  tm *tmNow;
  time_t ttNow;
  tm *ptm__local;
  MGT_DIR *p_local;
  
  ttNow = (time_t)ptm_;
  ptm__local = (tm *)p;
  memset(ptm_,0,0x38);
  if ((ptm__local[4].tm_year & 0x800000) == 0) {
    *(uint *)(ttNow + 4) = (uint)*(byte *)((long)&ptm__local[4].tm_wday + 1);
    *(uint *)(ttNow + 8) = (uint)(byte)ptm__local[4].tm_wday;
    *(uint *)(ttNow + 0xc) = (uint)*(byte *)((long)&ptm__local[4].tm_year + 1);
    *(uint *)(ttNow + 0x10) = *(byte *)((long)&ptm__local[4].tm_year + 2) - 1;
    *(uint *)(ttNow + 0x14) = (uint)*(byte *)((long)&ptm__local[4].tm_year + 3);
  }
  else {
    *(uint *)ttNow = (*(byte *)((long)&ptm__local[4].tm_wday + 1) & 0x1f) << 1;
    *(uint *)(ttNow + 4) =
         (int)(*(byte *)((long)&ptm__local[4].tm_wday + 1) & 0xe0) >> 2 |
         (byte)ptm__local[4].tm_wday & 7;
    *(int *)(ttNow + 8) = (int)((byte)ptm__local[4].tm_wday & 0xf8) >> 3;
    *(uint *)(ttNow + 0xc) = (uint)*(byte *)((long)&ptm__local[4].tm_year + 1);
    *(int *)(ttNow + 0x10) = (int)(*(byte *)((long)&ptm__local[4].tm_year + 2) & 0x71) >> 3;
    *(uint *)(ttNow + 0x14) = (uint)*(byte *)((long)&ptm__local[4].tm_year + 3);
  }
  if (*(int *)(ttNow + 0x14) < 0x50) {
    *(int *)(ttNow + 0x14) = *(int *)(ttNow + 0x14) + 100;
  }
  if (GetFileTime::nYear == 0) {
    tmNow = (tm *)time((time_t *)0x0);
    ptVar1 = localtime((time_t *)&tmNow);
    GetFileTime::nYear = ptVar1->tm_year + 0x76c;
  }
  if (((((GetFileTime::nYear < *(int *)(ttNow + 0x14) + 0x76c) || (*(int *)(ttNow + 0x10) < 0)) ||
       (0xb < *(int *)(ttNow + 0x10))) ||
      ((*(int *)(ttNow + 0xc) == 0 || (0x1f < *(int *)(ttNow + 0xc))))) ||
     ((0x17 < *(int *)(ttNow + 8) || ((0x3c < *(int *)(ttNow + 4) || (0x3c < *(int *)ttNow)))))) {
    p_local._7_1_ = false;
  }
  else {
    *(undefined4 *)(ttNow + 0x20) = 0xffffffff;
    tVar2 = mktime((tm *)ttNow);
    p_local._7_1_ = tVar2 != -1;
  }
  return p_local._7_1_;
}

Assistant:

bool GetFileTime(const MGT_DIR* p, struct tm* ptm_)
{
    memset(ptm_, 0, sizeof(*ptm_));

    // Check for a packed BDOS 1.4+ date
    if (p->bMonth & 0x80)
    {
        ptm_->tm_sec = (p->bMinute & 0x1f) << 1;
        ptm_->tm_min = ((p->bMinute & 0xe0) >> 2) | (p->bHour & 0x07);
        ptm_->tm_hour = (p->bHour & 0xf8) >> 3;
        //      ptm_->tm_wday =   p->bMonth & 0x07;         // mktime does this for us
        ptm_->tm_mday = p->bDay;
        ptm_->tm_mon = (p->bMonth & 0x71) >> 3;
        ptm_->tm_year = p->bYear;
    }

    // Normal format
    else
    {
        ptm_->tm_min = p->bMinute;
        ptm_->tm_hour = p->bHour;
        ptm_->tm_mday = p->bDay;
        ptm_->tm_mon = p->bMonth - 1;
        ptm_->tm_year = p->bYear;
    }

    // Base smaller year values from 2000 (BDOS considers <80 to be invalid)
    if (ptm_->tm_year < 80)
        ptm_->tm_year += 100;

    // Fetch the current year, if not already cached
    static int nYear = 0;
    if (!nYear)
    {
        time_t ttNow = time(nullptr);
        struct tm* tmNow = localtime(&ttNow);
        nYear = 1900 + tmNow->tm_year;
    }

    // Reject obviously invalid date components
    if (1900 + ptm_->tm_year > nYear ||
        ptm_->tm_mon < 0 || ptm_->tm_mon >= 12 ||
        ptm_->tm_mday == 0 || ptm_->tm_mday >  31 ||
        ptm_->tm_hour > 23 || ptm_->tm_min > 60 || ptm_->tm_sec > 60)
        return false;

    // All dates are taken to be in the local timezone, not UCT/GMT
    ptm_->tm_isdst = -1;

    // Validate the date components
    return mktime(ptm_) != -1;
}